

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchPrintNtkStats.cpp
# Opt level: O0

void Bmatch_PrintMatchPairs
               (vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                *a)

{
  size_type sVar1;
  reference pvVar2;
  char *pcVar3;
  size_type sVar4;
  reference ppsVar5;
  int local_1c;
  int m;
  int j;
  int n;
  int i;
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  *a_local;
  
  j = 0;
  sVar1 = std::
          vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
          ::size(a);
  for (; j < (int)sVar1; j = j + 1) {
    pvVar2 = std::
             vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
             ::operator[](a,(long)j);
    pcVar3 = Abc_ObjName(pvVar2->first->thisObj);
    printf("%7s is equivalent to : \n",pcVar3);
    local_1c = 0;
    pvVar2 = std::
             vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
             ::operator[](a,(long)j);
    sVar4 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size(&pvVar2->second);
    for (; local_1c < (int)sVar4; local_1c = local_1c + 1) {
      pvVar2 = std::
               vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
               ::operator[](a,(long)j);
      ppsVar5 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          (&pvVar2->second,(long)local_1c);
      if ((*ppsVar5)->status == NEGATIVE) {
        pvVar2 = std::
                 vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                 ::operator[](a,(long)j);
        ppsVar5 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                            (&pvVar2->second,(long)local_1c);
        pcVar3 = Abc_ObjName((*ppsVar5)->thisObj);
        printf("-%8s \n",pcVar3);
      }
      else {
        pvVar2 = std::
                 vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                 ::operator[](a,(long)j);
        ppsVar5 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                            (&pvVar2->second,(long)local_1c);
        pcVar3 = Abc_ObjName((*ppsVar5)->thisObj);
        printf("%9s \n",pcVar3);
      }
    }
  }
  return;
}

Assistant:

void Bmatch_PrintMatchPairs ( vector< pair < suppWrap *, vector< suppWrap * > > > & a )
{
    for( int i = 0, n = a.size(); i < n; ++i ) {
        printf("%7s is equivalent to : \n", Abc_ObjName( a[i].first->thisObj ) );
        for( int j = 0, m = a[i].second.size(); j < m; ++j ) {
        	if( a[i].second[j]->status == NEGATIVE )
            	printf( "-%8s \n", Abc_ObjName( a[i].second[j]->thisObj ));
            else
            	printf( "%9s \n", Abc_ObjName( a[i].second[j]->thisObj ));
        }
    }
}